

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<double>::InternalDeallocate<false>(RepeatedField<double> *this)

{
  ulong size;
  int iVar1;
  HeapRep HVar2;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *paVar3;
  HeapRep *p;
  LogMessageFatal LStack_28;
  
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&LStack_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x264,"!is_soo()");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_28);
  }
  iVar1 = (this->soo_rep_).field_0.long_rep.capacity;
  paVar3 = &heap_rep(this)->field_0;
  HVar2.field_0 = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1)paVar3->arena;
  paVar3 = &heap_rep(this)->field_0;
  size = (long)iVar1 * 8 + 8;
  if (HVar2.field_0 != (Arena *)0x0) {
    HVar2.field_0 = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1)paVar3->arena;
    p = heap_rep(this);
    internal::ThreadSafeArena::ReturnArrayMemory((ThreadSafeArena *)HVar2.field_0,p,size);
    return;
  }
  operator_delete(paVar3,size);
  return;
}

Assistant:

bool is_soo() const { return (arena_and_size & kNotSooBit) == 0; }